

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseCoeffsBase.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
          (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this,Index index)

{
  if ((-1 < index) && (index < *(long *)(this + 8))) {
    return (CoeffReturnType)(index * 8 + *(long *)this);
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x9c,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

operator[](Index index) const
    {
      #ifndef EIGEN2_SUPPORT
      EIGEN_STATIC_ASSERT(Derived::IsVectorAtCompileTime,
                          THE_BRACKET_OPERATOR_IS_ONLY_FOR_VECTORS__USE_THE_PARENTHESIS_OPERATOR_INSTEAD)
      #endif
      eigen_assert(index >= 0 && index < size());
      return derived().coeff(index);
    }